

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSession::BYEDestroy
          (RTPSession *this,RTPTime *maxwaittime,void *reason,size_t reasonlength)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  RTPTransmitter *pRVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  RTCPCompoundPacket *pRVar6;
  bool bVar7;
  int iVar8;
  _List_node_base *p_Var9;
  size_t sVar10;
  _List_node_base *p_Var11;
  double dVar12;
  RTCPCompoundPacket *pack;
  timespec tpMono;
  timespec tpMono_1;
  RTCPCompoundPacket *local_68;
  timespec local_60;
  _List_node_base *local_50;
  timespec local_48;
  double local_38;
  
  if (this->created == true) {
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_60);
      clock_gettime(1,&local_48);
      local_38 = (double)local_60.tv_nsec * 1e-09 + (double)local_60.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           local_38 - ((double)local_48.tv_nsec * 1e-09 + (double)local_48.tv_sec);
    }
    else {
      clock_gettime(1,&local_60);
      local_38 = (double)local_60.tv_nsec * 1e-09 + (double)local_60.tv_sec +
                 RTPTime::CurrentTime()::s_startOffet;
    }
    local_38 = local_38 + maxwaittime->m_t;
    if (this->sentpackets == true) {
      sVar10 = 0xff;
      if (reasonlength < 0xff) {
        sVar10 = reasonlength;
      }
      iVar8 = RTCPPacketBuilder::BuildBYEPacket
                        (&this->rtcpbuilder,&local_68,reason,sVar10,this->useSR_BYEifpossible);
      if (-1 < iVar8) {
        p_Var9 = (_List_node_base *)operator_new(0x18);
        p_Var9[1]._M_next = (_List_node_base *)local_68;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        sVar10 = (this->byepackets).
                 super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                 ._M_impl._M_node._M_size;
        (this->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node._M_size = sVar10 + 1;
        if (sVar10 == 0) {
          RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,local_68->compoundpacketlength);
        }
      }
    }
    local_50 = (_List_node_base *)&this->byepackets;
    if ((this->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node.super__List_node_base._M_next != local_50) {
      bVar7 = false;
      do {
        if (RTPTime::CurrentTime()::s_initialized == '\0') {
          RTPTime::CurrentTime()::s_initialized = '\x01';
          clock_gettime(0,&local_60);
          clock_gettime(1,&local_48);
          dVar12 = (double)local_60.tv_nsec * 1e-09 + (double)local_60.tv_sec;
          RTPTime::CurrentTime()::s_startOffet =
               dVar12 - ((double)local_48.tv_nsec * 1e-09 + (double)local_48.tv_sec);
        }
        else {
          clock_gettime(1,&local_60);
          dVar12 = (double)local_60.tv_nsec * 1e-09 + (double)local_60.tv_sec +
                   RTPTime::CurrentTime()::s_startOffet;
        }
        bVar5 = true;
        if (dVar12 < local_38) {
          bVar5 = bVar7;
        }
        bVar7 = RTCPScheduler::IsTime(&this->rtcpsched);
        if (bVar7) {
          p_Var9 = (this->byepackets).
                   super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
          local_68 = (RTCPCompoundPacket *)p_Var9[1]._M_next;
          psVar1 = &(this->byepackets).
                    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var9,0x18);
          SendRTCPData(this,local_68->compoundpacket,local_68->compoundpacketlength);
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_68);
          pRVar6 = local_68;
          pRVar2 = (this->super_RTPMemoryObject).mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            if (local_68 != (RTCPCompoundPacket *)0x0) {
              (*(code *)((_List_node_base *)(local_68->super_RTPMemoryObject)._vptr_RTPMemoryObject)
                        ->_M_prev)(local_68);
            }
          }
          else {
            (*(code *)((_List_node_base *)(local_68->super_RTPMemoryObject)._vptr_RTPMemoryObject)->
                      _M_next)(local_68);
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar6);
          }
          p_Var9 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                      *)&local_50->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var9 == local_50) break;
          RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,(size_t)p_Var9[1]._M_next[2]._M_next);
        }
        if (bVar5) break;
        local_60.tv_sec = 0;
        local_60.tv_nsec = 99999999;
        nanosleep(&local_60,&local_48);
        bVar7 = bVar5;
      } while( true );
    }
    p_Var9 = local_50;
    if (this->deletetransmitter == true) {
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      pRVar3 = this->rtptrans;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (pRVar3 != (RTPTransmitter *)0x0) {
          (*(pRVar3->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar3);
        }
      }
      else {
        (**(pRVar3->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar3);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar3);
      }
    }
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    RTCPScheduler::Reset(&this->rtcpsched);
    RTPCollisionList::Clear(&this->collisionlist);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    for (p_Var11 = (this->byepackets).
                   super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next; p_Var11 != p_Var9;
        p_Var11 = p_Var11->_M_next) {
      p_Var4 = p_Var11[1]._M_next;
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (p_Var4 != (_List_node_base *)0x0) {
          (**(code **)((long)p_Var4->_M_next + 8))(p_Var4);
        }
      }
      else {
        (**(code **)p_Var4->_M_next)(p_Var4);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var4);
      }
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              ((list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                *)p_Var9);
    this->created = false;
  }
  return;
}

Assistant:

void RTPSession::BYEDestroy(const RTPTime &maxwaittime,const void *reason,size_t reasonlength)
{
	if (!created)
		return;

	// first, stop the thread so we have full control over all components
	
#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD

	RTPTime stoptime = RTPTime::CurrentTime();
	stoptime += maxwaittime;

	// add bye packet to the list if we've sent data

	RTCPCompoundPacket *pack;

	if (sentpackets)
	{
		int status;
		
		reasonlength = (reasonlength>RTCP_BYE_MAXREASONLENGTH)?RTCP_BYE_MAXREASONLENGTH:reasonlength;
	       	status = rtcpbuilder.BuildBYEPacket(&pack,reason,reasonlength,useSR_BYEifpossible);
		if (status >= 0)
		{
			byepackets.push_back(pack);
	
			if (byepackets.size() == 1)
				rtcpsched.ScheduleBYEPacket(pack->GetCompoundPacketLength());
		}
	}
	
	if (!byepackets.empty())
	{
		bool done = false;
		
		while (!done)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			
			if (curtime >= stoptime)
				done = true;
		
			if (rtcpsched.IsTime())
			{
				pack = *(byepackets.begin());
				byepackets.pop_front();
			
				SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength());
				
				OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
				
				RTPDelete(pack,GetMemoryManager());
				if (!byepackets.empty()) // more bye packets to send, schedule them
					rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				else
					done = true;
			}
			if (!done)
				RTPTime::Wait(RTPTime(0,100000));
		}
	}
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	// clear rest of bye packets
	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}